

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::read_texture
          (HL1MDLLoader *this,Texture_HL1 *ptexture,uint8_t *data,uint8_t *pal,aiTexture *pResult,
          aiColor3D *last_palette_color)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  aiTexel *local_1070;
  aiTexel *out;
  uchar *pix4;
  uchar *pix3;
  uchar *pix2;
  uchar *pix1;
  int col2 [256];
  int col1 [256];
  int row2 [256];
  int row1 [256];
  int j;
  int i;
  int outheight;
  int outwidth;
  aiColor3D *last_palette_color_local;
  aiTexture *pResult_local;
  uint8_t *pal_local;
  uint8_t *data_local;
  Texture_HL1 *ptexture_local;
  HL1MDLLoader *this_local;
  
  for (i = 1; i < ptexture->width; i = i << 1) {
  }
  if (0x100 < i) {
    i = 0x100;
  }
  for (j = 1; j < ptexture->height; j = j << 1) {
  }
  if (0x100 < j) {
    j = 0x100;
  }
  aiString::operator=(&pResult->mFilename,ptexture->name);
  pResult->mWidth = i;
  pResult->mHeight = j;
  builtin_strncpy(pResult->achFormatHint,"bgra8888",9);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(i * j);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_1070 = (aiTexel *)operator_new__(uVar2);
  pResult->pcData = local_1070;
  for (row1[0xff] = 0; row1[0xff] < i; row1[0xff] = row1[0xff] + 1) {
    col2[(long)row1[0xff] + 0xfe] =
         (int)(((float)row1[0xff] + 0.25) * ((float)ptexture->width / (float)i));
    col2[(long)row1[0xff] + -2] =
         (int)(((float)row1[0xff] + 0.75) * ((float)ptexture->width / (float)i));
  }
  for (row1[0xff] = 0; row1[0xff] < j; row1[0xff] = row1[0xff] + 1) {
    row2[(long)row1[0xff] + 0xfe] =
         (int)(((float)row1[0xff] + 0.25) * ((float)ptexture->height / (float)j)) * ptexture->width;
    col1[(long)row1[0xff] + 0xfe] =
         (int)(((float)row1[0xff] + 0.75) * ((float)ptexture->height / (float)j)) * ptexture->width;
  }
  for (row1[0xff] = 0; row1[0xff] < j; row1[0xff] = row1[0xff] + 1) {
    for (row1[0xfe] = 0; row1[0xfe] < i; row1[0xfe] = row1[0xfe] + 1) {
      pbVar3 = pal + (int)((uint)data[row2[(long)row1[0xff] + 0xfe] + col2[(long)row1[0xfe] + 0xfe]]
                          * 3);
      pbVar4 = pal + (int)((uint)data[row2[(long)row1[0xff] + 0xfe] + col2[(long)row1[0xfe] + -2]] *
                          3);
      pbVar5 = pal + (int)((uint)data[col1[(long)row1[0xff] + 0xfe] + col2[(long)row1[0xfe] + 0xfe]]
                          * 3);
      pbVar6 = pal + (int)((uint)data[col1[(long)row1[0xff] + 0xfe] + col2[(long)row1[0xfe] + -2]] *
                          3);
      local_1070->r =
           (uchar)((int)((uint)*pbVar3 + (uint)*pbVar4 + (uint)*pbVar5 + (uint)*pbVar6) >> 2);
      local_1070->g =
           (uchar)((int)((uint)pbVar3[1] + (uint)pbVar4[1] + (uint)pbVar5[1] + (uint)pbVar6[1]) >> 2
                  );
      local_1070->b =
           (uchar)((int)((uint)pbVar3[2] + (uint)pbVar4[2] + (uint)pbVar5[2] + (uint)pbVar6[2]) >> 2
                  );
      local_1070->a = 0xff;
      local_1070 = local_1070 + 1;
    }
  }
  last_palette_color->r = (float)pal[0x2fd];
  last_palette_color->g = (float)pal[0x2fe];
  last_palette_color->b = (float)pal[0x2ff];
  return;
}

Assistant:

void HL1MDLLoader::read_texture(const Texture_HL1 *ptexture,
        uint8_t *data, uint8_t *pal, aiTexture *pResult,
        aiColor3D &last_palette_color) {
    int outwidth, outheight;
    int i, j;
    int row1[256], row2[256], col1[256], col2[256];
    unsigned char *pix1, *pix2, *pix3, *pix4;

    // convert texture to power of 2
    for (outwidth = 1; outwidth < ptexture->width; outwidth <<= 1)
        ;

    if (outwidth > 256)
        outwidth = 256;

    for (outheight = 1; outheight < ptexture->height; outheight <<= 1)
        ;

    if (outheight > 256)
        outheight = 256;

    pResult->mFilename = ptexture->name;
    pResult->mWidth = outwidth;
    pResult->mHeight = outheight;
    pResult->achFormatHint[0] = 'b';
    pResult->achFormatHint[1] = 'g';
    pResult->achFormatHint[2] = 'r';
    pResult->achFormatHint[3] = 'a';
    pResult->achFormatHint[4] = '8';
    pResult->achFormatHint[5] = '8';
    pResult->achFormatHint[6] = '8';
    pResult->achFormatHint[7] = '8';
    pResult->achFormatHint[8] = '\0';

    aiTexel *out = pResult->pcData = new aiTexel[outwidth * outheight];

    for (i = 0; i < outwidth; i++) {
        col1[i] = (int)((i + 0.25) * (ptexture->width / (float)outwidth));
        col2[i] = (int)((i + 0.75) * (ptexture->width / (float)outwidth));
    }

    for (i = 0; i < outheight; i++) {
        row1[i] = (int)((i + 0.25) * (ptexture->height / (float)outheight)) * ptexture->width;
        row2[i] = (int)((i + 0.75) * (ptexture->height / (float)outheight)) * ptexture->width;
    }

    // scale down and convert to 32bit RGB
    for (i = 0; i < outheight; i++) {
        for (j = 0; j < outwidth; j++, out++) {
            pix1 = &pal[data[row1[i] + col1[j]] * 3];
            pix2 = &pal[data[row1[i] + col2[j]] * 3];
            pix3 = &pal[data[row2[i] + col1[j]] * 3];
            pix4 = &pal[data[row2[i] + col2[j]] * 3];

            out->r = (pix1[0] + pix2[0] + pix3[0] + pix4[0]) >> 2;
            out->g = (pix1[1] + pix2[1] + pix3[1] + pix4[1]) >> 2;
            out->b = (pix1[2] + pix2[2] + pix3[2] + pix4[2]) >> 2;
            out->a = 0xFF;
        }
    }

    // Get the last palette color.
    last_palette_color.r = pal[255 * 3];
    last_palette_color.g = pal[255 * 3 + 1];
    last_palette_color.b = pal[255 * 3 + 2];
}